

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O1

void __thiscall
brynet::net::TcpService::postSessionAsyncProc
          (TcpService *this,SESSION_TYPE id,function<void_(brynet::net::DataSocket_*)> *callback)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Manager_type p_Var2;
  EventLoop *this_00;
  element_type *peVar3;
  element_type *peVar4;
  undefined8 uVar5;
  undefined8 this_01;
  type callbackCapture;
  shared_ptr<const_brynet::net::TcpService> shared_this;
  _Any_data local_d0;
  element_type *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b8;
  element_type *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  element_type *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  element_type *local_90;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type local_70;
  undefined1 local_68 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_58;
  element_type *local_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  getIOLoopDataBySocketID((TcpService *)local_68,(SESSION_TYPE)this);
  uVar5 = local_68._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_78 = (_Manager_type)0x0;
    local_70 = callback->_M_invoker;
    p_Var2 = (callback->super__Function_base)._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      local_88._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
      local_88._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
      (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
      callback->_M_invoker = (_Invoker_type)0x0;
      local_78 = p_Var2;
    }
    std::__shared_ptr<brynet::net::TcpService_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<brynet::net::TcpService,void>
              ((__shared_ptr<brynet::net::TcpService_const,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (__weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<brynet::net::TcpService>);
    this_01 = local_68._8_8_;
    local_68._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68._8_8_ = (element_type *)0x0;
    this_00 = (EventLoop *)
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0x10))->
              _vptr__Sp_counted_base;
    std::function<void_(brynet::net::DataSocket_*)>::function
              ((function<void_(brynet::net::DataSocket_*)> *)&local_d0,
               (function<void_(brynet::net::DataSocket_*)> *)&local_88);
    local_a8 = local_58._M_pi;
    local_a0 = local_50;
    if (local_50 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_50->super_enable_shared_from_this<brynet::net::IOLoopData>)._M_weak_this.
                  super___weak_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var1 = &(local_50->super_enable_shared_from_this<brynet::net::IOLoopData>)._M_weak_this.
                  super___weak_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      }
    }
    local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
    local_90 = (element_type *)this_01;
    if ((element_type *)this_01 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((enable_shared_from_this<brynet::net::TcpService> *)(this_01 + 8))->_M_weak_this)
                 .super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((enable_shared_from_this<brynet::net::TcpService> *)(this_01 + 8))->
                      _M_weak_this).
                      super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             1;
        UNLOCK();
      }
      else {
        *(int *)&(((enable_shared_from_this<brynet::net::TcpService> *)(this_01 + 8))->_M_weak_this)
                 .super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((enable_shared_from_this<brynet::net::TcpService> *)(this_01 + 8))->
                      _M_weak_this).
                      super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             1;
      }
    }
    local_38 = (code *)0x0;
    pcStack_30 = (code *)0x0;
    local_48._M_unused._M_object = (pointer)0x0;
    local_48._8_8_ = (pointer)0x0;
    local_b0 = (element_type *)id;
    local_48._M_unused._M_object = operator_new(0x48);
    peVar4 = local_90;
    peVar3 = local_a0;
    (((pointer)local_48._M_unused._0_8_)->
    super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (((pointer)local_48._M_unused._0_8_)->
    super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((pointer)((long)local_48._M_unused._0_8_ + 0x10))->
    super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (((pointer)((long)local_48._M_unused._0_8_ + 0x10))->
    super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         p_Stack_b8;
    if (local_c0 != (element_type *)0x0) {
      (((pointer)local_48._M_unused._0_8_)->
      super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)local_d0._M_unused._0_8_;
      (((pointer)local_48._M_unused._0_8_)->
      super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_;
      (((pointer)((long)local_48._M_unused._0_8_ + 0x10))->
      super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_c0;
      local_c0 = (element_type *)0x0;
      p_Stack_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    (((pointer)((long)local_48._M_unused._0_8_ + 0x20))->
    super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_b0;
    (((pointer)((long)local_48._M_unused._0_8_ + 0x20))->
    super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         local_a8;
    (((pointer)((long)local_48._M_unused._0_8_ + 0x30))->
    super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    local_a0 = (element_type *)0x0;
    (((pointer)((long)local_48._M_unused._0_8_ + 0x30))->
    super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar3;
    local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((pointer)((long)local_48._M_unused._0_8_ + 0x30))->
    super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         local_98;
    (((pointer)((long)local_48._M_unused._0_8_ + 0x40))->
    super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    local_90 = (element_type *)0x0;
    (((pointer)((long)local_48._M_unused._0_8_ + 0x40))->
    super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)peVar4;
    local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pcStack_30 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:140:30)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:140:30)>
               ::_M_manager;
    EventLoop::pushAsyncProc(this_00,(USER_PROC *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,3);
    }
    if (local_90 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90);
    }
    if (local_a0 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0);
    }
    if (local_c0 != (element_type *)0x0) {
      (*(code *)local_c0)(&local_d0,&local_d0,__destroy_functor);
    }
    if ((element_type *)this_01 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if (local_50 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50);
    }
    if (local_78 != (_Manager_type)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
  }
  if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  return;
}

Assistant:

void TcpService::postSessionAsyncProc(SESSION_TYPE id, 
    std::function<void(DataSocket::PTR)> callback) const
{
    union  SessionId sid;
    sid.id = id;
    auto ioLoopData = getIOLoopDataBySocketID(id);
    if (ioLoopData == nullptr)
    {
        return;
    }

    const auto& eventLoop = ioLoopData->getEventLoop();
    auto callbackCapture = std::move(callback);
    auto shared_this = shared_from_this();
    auto ioLoopDataCapture = std::move(ioLoopData);
    eventLoop->pushAsyncProc([callbackCapture, 
        sid, 
        shared_this, 
        ioLoopDataCapture](){
        DataSocket::PTR tmp = nullptr;
        if (callbackCapture != nullptr &&
            ioLoopDataCapture->getDataSockets().get(sid.data.index, tmp) &&
            tmp != nullptr)
        {
            const auto ud = brynet::net::cast<SESSION_TYPE>(tmp->getUD());
            if (ud != nullptr && *ud == sid.id)
            {
                callbackCapture(tmp);
            }
        }
    });
}